

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundFMOD.cpp
# Opt level: O1

FMOD_RESULT
XPMP2::SoundSystemFMOD::SoundLogCB
          (FMOD_DEBUG_FLAGS flags,char *file,int line,char *func,char *message)

{
  logLevelTy lvl;
  
  lvl = logERR;
  if ((flags & 1) == 0) {
    lvl = logWARN - ((flags & 2) == 0);
  }
  LogMsg(file,line,func,lvl,"FMOD_LOG: %s",message);
  return FMOD_OK;
}

Assistant:

FMOD_RESULT F_CALLBACK SoundSystemFMOD::SoundLogCB(FMOD_DEBUG_FLAGS flags,
                                                   const char * file,
                                                   int line,
                                                   const char * func,
                                                   const char *message)
{
    // Basically convert it to our standard log output
    LogMsg(file, line, func,
           flags & FMOD_DEBUG_LEVEL_ERROR   ? logERR  :
           flags & FMOD_DEBUG_LEVEL_WARNING ? logWARN : logINFO,
           "FMOD_LOG: %s", message);
    return FMOD_OK;
}